

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_image_extract_palette_to_buffer(rf_image image,rf_color *palette_dst,rf_int palette_size)

{
  long lVar1;
  rf_source_location source_location;
  rf_image image_00;
  undefined1 auVar2 [16];
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  rf_color b;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 uStack_7c;
  long local_48;
  rf_int i;
  _Bool color_found;
  long lStack_38;
  rf_color color;
  rf_int palette_iter;
  rf_int img_iter;
  uchar *img_data;
  int img_bpp;
  int img_size;
  rf_int palette_size_local;
  rf_color *palette_dst_local;
  
  _Var4 = rf_is_uncompressed_format(image.format);
  if (_Var4) {
    if (palette_size < 1) {
      rf_log_impl(4,0x1b260e);
    }
    else {
      auVar2 = image._8_16_;
      image_00.format = (int)in_stack_ffffffffffffff50;
      image_00.valid = (_Bool)(char)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      image_00._21_3_ = (int3)((ulong)in_stack_ffffffffffffff50 >> 0x28);
      image_00.data = (void *)auVar2._0_8_;
      image_00.width = auVar2._8_4_;
      image_00.height = auVar2._12_4_;
      iVar5 = rf_image_size(image_00);
      iVar6 = rf_bytes_per_pixel(image.format);
      lStack_38 = 0;
      for (palette_iter = 0; palette_iter < iVar5 && lStack_38 < palette_size;
          palette_iter = iVar6 + palette_iter) {
        b = rf_format_one_pixel_to_rgba32((void *)image._0_16_,image.format);
        bVar3 = false;
        for (local_48 = 0; local_48 < lStack_38; local_48 = local_48 + 1) {
          _Var4 = rf_color_match(palette_dst[local_48],b);
          if (_Var4) {
            bVar3 = true;
            break;
          }
        }
        if (!bVar3) {
          palette_dst[lStack_38] = b;
          lStack_38 = lStack_38 + 1;
        }
      }
    }
  }
  else {
    source_location.proc_name = "rf_image_extract_palette_to_buffer";
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.line_in_file = 0x3bff;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Function only works for uncompressed formats but was called with format %d.",1,
                (ulong)image.format,"rf_image_extract_palette_to_buffer",in_R9);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_extract_palette_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3bff;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_7c,1);
  }
  return;
}

Assistant:

RF_API void rf_image_extract_palette_to_buffer(rf_image image, rf_color* palette_dst, rf_int palette_size)
{
    if (rf_is_uncompressed_format(image.format))
    {
        if (palette_size > 0)
        {
            int img_size = rf_image_size(image);
            int img_bpp  = rf_bytes_per_pixel(image.format);
            const unsigned char* img_data = (unsigned char*) image.data;

            for (rf_int img_iter = 0, palette_iter = 0; img_iter < img_size && palette_iter < palette_size; img_iter += img_bpp)
            {
                rf_color color = rf_format_one_pixel_to_rgba32(img_data, image.format);

                bool color_found = false;

                for (rf_int i = 0; i < palette_iter; i++)
                {
                    if (rf_color_match(palette_dst[i], color))
                    {
                        color_found = true;
                        break;
                    }
                }

                if (!color_found)
                {
                    palette_dst[palette_iter] = color;
                    palette_iter++;
                }
            }
        }
        else RF_LOG(RF_LOG_TYPE_WARNING, "Palette size was 0.");
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);
}